

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.h
# Opt level: O0

FString __thiscall ExpVal::GetString(ExpVal *this)

{
  char *copyStr;
  long *in_RSI;
  FName local_1c [3];
  ExpVal *this_local;
  
  this_local = this;
  if ((PString *)*in_RSI == TypeString) {
    FString::FString((FString *)this,(FString *)(in_RSI + 1));
  }
  else if ((PName *)*in_RSI == TypeName) {
    FName::FName(local_1c,*(ENamedName *)(in_RSI + 1));
    copyStr = FName::GetChars(local_1c);
    FString::FString((FString *)this,copyStr);
  }
  else {
    FString::FString((FString *)this,"");
  }
  return (FString)(char *)this;
}

Assistant:

const FString GetString() const
	{
		return Type == TypeString ? *(FString *)&pointer : Type == TypeName ? FString(FName(ENamedName(Int)).GetChars()) : "";
	}